

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O2

unsigned_long o3dgc::Insert(SC3DMCTriplet e,unsigned_long *nPred,SC3DMCPredictor *list)

{
  bool bVar1;
  ulong uVar2;
  SC3DMCPredictor *__dest;
  ulong uVar3;
  SC3DMCPredictor *rhs;
  
  uVar3 = 0;
  rhs = list;
  do {
    uVar2 = *nPred;
    if (uVar2 <= uVar3) {
      uVar3 = 0xffffffff;
      if (uVar2 < 2) {
        *nPred = uVar2 + 1;
        rhs = list + uVar2;
        uVar3 = uVar2;
LAB_00505d7a:
        (rhs->m_id).m_c = e.m_c;
        (rhs->m_id).m_a = e.m_a;
        (rhs->m_id).m_b = e.m_b;
      }
      return uVar3;
    }
    bVar1 = operator==(&e,&rhs->m_id);
    if (bVar1) {
      return 0xffffffff;
    }
    bVar1 = operator<(&e,&rhs->m_id);
    if (bVar1) {
      uVar2 = *nPred;
      if (uVar2 < 2) {
        uVar2 = uVar2 + 1;
        *nPred = uVar2;
      }
      __dest = list + (uVar2 - 1);
      while (uVar2 = uVar2 - 1, uVar3 < uVar2) {
        memcpy(__dest,__dest + -1,0x118);
        __dest = __dest + -1;
      }
      goto LAB_00505d7a;
    }
    uVar3 = uVar3 + 1;
    rhs = rhs + 1;
  } while( true );
}

Assistant:

inline unsigned long Insert(SC3DMCTriplet e, unsigned long & nPred, SC3DMCPredictor * const list)
    {
        unsigned long pos = 0xFFFFFFFF;
        bool foundOrInserted = false;
        for (unsigned long j = 0; j < nPred; ++j)
        {
            if (e == list[j].m_id)
            {
                foundOrInserted = true;
                break;
            }
            else if (e < list[j].m_id)
            {
                if (nPred < O3DGC_SC3DMC_MAX_PREDICTION_NEIGHBORS)
                {
                    ++nPred;
                }
                for (unsigned long h = nPred-1; h > j; --h)
                {
                    list[h] = list[h-1];
                }
                list[j].m_id = e;
                pos = j;
                foundOrInserted = true;
                break;
            }
        }
        if (!foundOrInserted && nPred < O3DGC_SC3DMC_MAX_PREDICTION_NEIGHBORS)
        {
            pos = nPred;
            list[nPred++].m_id = e;
        }
        return pos;
    }